

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O0

OclPlatform __thiscall xmrig::OclConfig::platform(OclConfig *this)

{
  OclPlatform OVar1;
  bool bVar2;
  reference pOVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  long in_RDI;
  OclPlatform *platform;
  const_iterator __end2;
  const_iterator __begin2;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *__range2;
  String vendor;
  String search;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> platforms;
  String *in_stack_ffffffffffffff38;
  String *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4f;
  String *in_stack_ffffffffffffff50;
  __normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
  local_78;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *local_70;
  String local_58 [2];
  int local_34;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> local_30;
  OclPlatform local_10;
  
  OclPlatform::get();
  bVar2 = std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::empty
                    ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)
                     in_stack_ffffffffffffff50);
  if (bVar2) {
    memset(&local_10,0,0x10);
    OclPlatform::OclPlatform(&local_10);
    local_34 = 1;
  }
  else {
    bVar2 = String::isEmpty((String *)0x20ee7b);
    if (bVar2) {
      uVar4 = (ulong)*(uint *)(in_RDI + 0x70);
      sVar5 = std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::size(&local_30);
      if (uVar4 < sVar5) {
        pvVar6 = std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::operator[]
                           (&local_30,(ulong)*(uint *)(in_RDI + 0x70));
        local_10.m_id = pvVar6->m_id;
        local_10.m_index = pvVar6->m_index;
        local_34 = 1;
        goto LAB_0020f197;
      }
    }
    else {
      String::String(local_58);
      String::String(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      String::toUpper((String *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      bVar2 = String::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if (bVar2) {
        String::operator=(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      }
      else {
        bVar2 = String::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        if (bVar2) {
          String::operator=(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        }
        else {
          bVar2 = String::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          if (bVar2) {
            String::operator=(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          }
          else {
            String::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          }
        }
      }
      local_70 = &local_30;
      local_78._M_current =
           (OclPlatform *)
           std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::begin
                     ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)
                      in_stack_ffffffffffffff38);
      std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::end
                ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)
                 in_stack_ffffffffffffff38);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
                                 *)in_stack_ffffffffffffff40,
                                (__normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
                                 *)in_stack_ffffffffffffff38), bVar2) {
        pOVar3 = __gnu_cxx::
                 __normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
                 ::operator*(&local_78);
        OclPlatform::vendor((OclPlatform *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        in_stack_ffffffffffffff50 = (String *)String::operator_cast_to_char_(local_58);
        in_stack_ffffffffffffff4f =
             String::contains(in_stack_ffffffffffffff50,
                              (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48))
        ;
        String::~String(in_stack_ffffffffffffff40);
        if ((in_stack_ffffffffffffff4f & 1) != 0) {
          local_10.m_id = pOVar3->m_id;
          local_10.m_index = pOVar3->m_index;
          local_34 = 1;
          goto LAB_0020f0c7;
        }
        __gnu_cxx::
        __normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
        ::operator++(&local_78);
      }
      local_34 = 0;
LAB_0020f0c7:
      String::~String(in_stack_ffffffffffffff40);
      String::~String(in_stack_ffffffffffffff40);
      if (local_34 != 0) goto LAB_0020f197;
    }
    memset(&local_10,0,0x10);
    OclPlatform::OclPlatform(&local_10);
    local_34 = 1;
  }
LAB_0020f197:
  std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::~vector
            ((vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)
             in_stack_ffffffffffffff50);
  OVar1.m_index = local_10.m_index;
  OVar1.m_id = local_10.m_id;
  return OVar1;
}

Assistant:

xmrig::OclPlatform xmrig::OclConfig::platform() const
{
    const auto platforms = OclPlatform::get();
    if (platforms.empty()) {
        return {};
    }

    if (!m_platformVendor.isEmpty()) {
        String search;
        String vendor = m_platformVendor;
        vendor.toUpper();

        if (vendor == kAMD) {
            search = "Advanced Micro Devices";
        }
        else if (vendor == kNVIDIA) {
            search = kNVIDIA;
        }
        else if (vendor == kINTEL) {
            search = "Intel";
        }
        else {
            search = m_platformVendor;
        }

        for (const auto &platform : platforms) {
            if (platform.vendor().contains(search)) {
                return platform;
            }
        }
    }
    else if (m_platformIndex < platforms.size()) {
        return platforms[m_platformIndex];
    }

    return {};
}